

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkVerifyReportErrorSeq(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel,int nFrames)

{
  Abc_NtkType_t AVar1;
  Abc_NtkType_t AVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Abc_Obj_t *local_70;
  ulong local_58;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  AVar1 = pNtk1->ntkType;
  if (AVar1 != ABC_NTK_STRASH) {
    pNtk1 = Abc_NtkStrash(pNtk1,0,0,0);
  }
  AVar2 = pNtk2->ntkType;
  if (AVar2 != ABC_NTK_STRASH) {
    pNtk2 = Abc_NtkStrash(pNtk2,0,0,0);
  }
  p = Sim_SimulateSeqModel(pNtk1,nFrames,pModel);
  p_00 = Sim_SimulateSeqModel(pNtk2,nFrames,pModel);
  uVar8 = 0;
  local_70 = (Abc_Obj_t *)0x0;
  local_44 = 0xffffffff;
  uVar12 = 0;
  local_58 = 0xffffffff;
  local_40 = local_44;
  local_3c = local_44;
  while (((long)uVar8 < (long)nFrames && (local_70 == (Abc_Obj_t *)0x0))) {
    local_70 = (Abc_Obj_t *)0x0;
    for (uVar9 = 0; (int)uVar9 < pNtk1->vPos->nSize; uVar9 = uVar9 + 1) {
      pAVar3 = Abc_NtkPo(pNtk1,uVar9);
      pAVar4 = Abc_NtkPo(pNtk2,uVar9);
      iVar7 = *(int *)((long)p->pArray[pAVar3->Id] + uVar8 * 4);
      iVar10 = *(int *)((long)p_00->pArray[pAVar4->Id] + uVar8 * 4);
      if (iVar7 != iVar10) {
        uVar12 = uVar12 + 1;
        if (local_70 == (Abc_Obj_t *)0x0) {
          local_3c = (uint)(iVar7 != 0);
          local_40 = (uint)(iVar10 != 0);
          local_58 = uVar8 & 0xffffffff;
          local_70 = pAVar3;
          local_44 = uVar9;
        }
      }
    }
    uVar8 = uVar8 + 1;
  }
  if (local_70 == (Abc_Obj_t *)0x0) {
    puts("No output mismatches detected.");
  }
  else {
    pcVar6 = "";
    if (1 < (int)uVar12) {
      pcVar6 = "s";
    }
    iVar7 = (int)local_58;
    printf("Verification failed for at least %d output%s of frame %d: ",(ulong)uVar12,pcVar6,
           (ulong)(iVar7 + 1));
    lVar5 = (long)iVar7;
    uVar9 = 0;
    for (iVar10 = 0; iVar10 < pNtk1->vPos->nSize; iVar10 = iVar10 + 1) {
      pAVar3 = Abc_NtkPo(pNtk1,iVar10);
      pAVar4 = Abc_NtkPo(pNtk2,iVar10);
      if (*(int *)((long)p->pArray[pAVar3->Id] + lVar5 * 4) !=
          *(int *)((long)p_00->pArray[pAVar4->Id] + lVar5 * 4)) {
        pcVar6 = Abc_ObjName(pAVar3);
        printf(" %s",pcVar6);
        uVar9 = uVar9 + 1;
        if (uVar9 == 3) {
          uVar9 = 3;
          break;
        }
      }
    }
    if (uVar9 != uVar12) {
      printf(" ...");
    }
    putchar(10);
    Abc_NtkGetSeqPoSupp(pNtk1,iVar7,local_44);
    Abc_NtkGetSeqPoSupp(pNtk2,iVar7,local_44);
    pcVar6 = Abc_ObjName(local_70);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar6,(ulong)local_3c,
           (ulong)local_40);
    pcVar6 = Abc_ObjName(local_70);
    printf("The cone of influence of output %s in Network1:\n",pcVar6);
    printf("PIs: ");
    for (iVar7 = 0; iVar7 < pNtk1->vPis->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkPi(pNtk1,iVar7);
      if ((pAVar3->field_6).pTemp != (void *)0x0) {
        pcVar6 = Abc_ObjName(pAVar3);
        printf("%s ",pcVar6);
      }
    }
    putchar(10);
    printf("Latches: ");
    for (iVar7 = 0; iVar7 < pNtk1->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pNtk1,iVar7);
      if (((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) && ((pAVar3->field_6).pTemp != (void *)0x0)) {
        pcVar6 = Abc_ObjName(pAVar3);
        printf("%s ",pcVar6);
      }
    }
    putchar(10);
    pcVar6 = Abc_ObjName(local_70);
    printf("The cone of influence of output %s in Network2:\n",pcVar6);
    printf("PIs: ");
    for (iVar7 = 0; iVar7 < pNtk2->vPis->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkPi(pNtk2,iVar7);
      if ((pAVar3->field_6).pTemp != (void *)0x0) {
        pcVar6 = Abc_ObjName(pAVar3);
        printf("%s ",pcVar6);
      }
    }
    putchar(10);
    printf("Latches: ");
    for (iVar7 = 0; iVar7 < pNtk2->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pNtk2,iVar7);
      if (((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) && ((pAVar3->field_6).pTemp != (void *)0x0)) {
        pcVar6 = Abc_ObjName(pAVar3);
        printf("%s ",pcVar6);
      }
    }
    putchar(10);
    lVar11 = 0;
    while (lVar11 <= lVar5) {
      printf("Frame %d:  ");
      printf("PI(1):");
      for (iVar7 = 0; iVar7 < pNtk1->vPis->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkPi(pNtk1,iVar7);
        if ((pAVar3->field_6).pTemp != (void *)0x0) {
          printf("%d",(ulong)(*(int *)((long)p->pArray[pAVar3->Id] + lVar11 * 4) != 0));
        }
      }
      putchar(0x20);
      printf("L(1):");
      for (iVar7 = 0; iVar7 < pNtk1->vBoxes->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkBox(pNtk1,iVar7);
        if (((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) && ((pAVar3->field_6).pTemp != (void *)0x0))
        {
          printf("%d",(ulong)(*(int *)((long)p->pArray[pAVar3->Id] + lVar11 * 4) != 0));
        }
      }
      putchar(0x20);
      pcVar6 = Abc_ObjName(local_70);
      printf("%s(1):",pcVar6);
      printf("%d",(ulong)(*(int *)((long)p->pArray[local_70->Id] + lVar11 * 4) != 0));
      printf("  ");
      printf("PI(2):");
      for (iVar7 = 0; iVar7 < pNtk2->vPis->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkPi(pNtk2,iVar7);
        if ((pAVar3->field_6).pTemp != (void *)0x0) {
          printf("%d",(ulong)(*(int *)((long)p_00->pArray[pAVar3->Id] + lVar11 * 4) != 0));
        }
      }
      putchar(0x20);
      printf("L(2):");
      for (iVar7 = 0; iVar7 < pNtk2->vBoxes->nSize; iVar7 = iVar7 + 1) {
        pAVar3 = Abc_NtkBox(pNtk2,iVar7);
        if (((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) && ((pAVar3->field_6).pTemp != (void *)0x0))
        {
          printf("%d",(ulong)(*(int *)((long)p_00->pArray[pAVar3->Id] + lVar11 * 4) != 0));
        }
      }
      putchar(0x20);
      pcVar6 = Abc_ObjName(local_70);
      printf("%s(2):",pcVar6);
      printf("%d",(ulong)(*(int *)((long)p_00->pArray[local_70->Id] + lVar11 * 4) != 0));
      putchar(10);
      lVar11 = lVar11 + 1;
    }
    for (iVar7 = 0; iVar7 < pNtk1->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkCi(pNtk1,iVar7);
      (pAVar3->field_6).pTemp = (void *)0x0;
    }
    for (iVar7 = 0; iVar7 < pNtk2->vCis->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkCi(pNtk2,iVar7);
      (pAVar3->field_6).pTemp = (void *)0x0;
    }
  }
  Sim_UtilInfoFree(p);
  Sim_UtilInfoFree(p_00);
  if (AVar1 != ABC_NTK_STRASH) {
    Abc_NtkDelete(pNtk1);
  }
  if (AVar2 == ABC_NTK_STRASH) {
    return;
  }
  Abc_NtkDelete(pNtk2);
  return;
}

Assistant:

void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames )
{
    Vec_Ptr_t * vInfo1, * vInfo2;
    Abc_Obj_t * pObj, * pObjError, * pObj1, * pObj2;
    int ValueError1 = -1, ValueError2 = -1;
    unsigned * pPats1, * pPats2;
    int i, o, k, nErrors, iFrameError = -1, iNodePo = -1, nPrinted;
    int fRemove1 = 0, fRemove2 = 0;

    if ( !Abc_NtkIsStrash(pNtk1) )
        fRemove1 = 1, pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );
    if ( !Abc_NtkIsStrash(pNtk2) )
        fRemove2 = 1, pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );

    // simulate sequential circuits
    vInfo1 = Sim_SimulateSeqModel( pNtk1, nFrames, pModel );
    vInfo2 = Sim_SimulateSeqModel( pNtk2, nFrames, pModel );

    // look for a discrepancy in the PO values
    nErrors = 0;
    pObjError = NULL;
    for ( i = 0; i < nFrames; i++ )
    {
        if ( pObjError )
            break;
        Abc_NtkForEachPo( pNtk1, pObj1, o )
        {
            pObj2  = Abc_NtkPo( pNtk2, o );
            pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
            pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
            if ( pPats1[i] == pPats2[i] )
                continue;
            nErrors++;
            if ( pObjError == NULL )
            {
                pObjError   = pObj1;
                iFrameError = i;
                iNodePo     = o;
                ValueError1 = (pPats1[i] > 0);
                ValueError2 = (pPats2[i] > 0);
            }
        }
    }

    if ( pObjError == NULL )
    {
        printf( "No output mismatches detected.\n" );
        Sim_UtilInfoFree( vInfo1 );
        Sim_UtilInfoFree( vInfo2 );
        if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
        if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
        return;
    }

    printf( "Verification failed for at least %d output%s of frame %d: ", nErrors, (nErrors>1? "s":""), iFrameError+1 );
    // print the first 3 outputs
    nPrinted = 0;
    Abc_NtkForEachPo( pNtk1, pObj1, o )
    {
        pObj2 = Abc_NtkPo( pNtk2, o );
        pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
        pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
        if ( pPats1[iFrameError] == pPats2[iFrameError] )
            continue;
        printf( " %s", Abc_ObjName(pObj1) );
        if ( ++nPrinted == 3 )
            break;
    }
    if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );

    // mark CIs of the networks in the cone of influence of this output
    Abc_NtkGetSeqPoSupp( pNtk1, iFrameError, iNodePo );
    Abc_NtkGetSeqPoSupp( pNtk2, iFrameError, iNodePo );

    // report mismatch for the first output
    printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
        Abc_ObjName(pObjError), ValueError1, ValueError2 );

    printf( "The cone of influence of output %s in Network1:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    printf( "The cone of influence of output %s in Network2:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    // print the patterns
    for ( i = 0; i <= iFrameError; i++ )
    {
        printf( "Frame %d:  ", i+1 );

        printf( "PI(1):" );
        Abc_NtkForEachPi( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "L(1):" );
        Abc_NtkForEachLatch( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(1):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo1, pObjError)[i] > 0 );

        printf( "  " );

        printf( "PI(2):" );
        Abc_NtkForEachPi( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "L(2):" );
        Abc_NtkForEachLatch( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(2):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo2, pObjError)[i] > 0 );

        printf( "\n" );
    }
    Abc_NtkForEachCi( pNtk1, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachCi( pNtk2, pObj, i )
        pObj->pCopy = NULL;

    Sim_UtilInfoFree( vInfo1 );
    Sim_UtilInfoFree( vInfo2 );
    if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
    if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
}